

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O2

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  Mat *pMVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  Allocator *pAVar5;
  long *plVar6;
  int _h;
  int *piVar7;
  Layer *pLVar8;
  int _w;
  int i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 *puVar13;
  _func_int *p_Var14;
  int iVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  bool bVar19;
  ParamDict permute_pd;
  ParamDict pd;
  Mat local_128;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined8 local_a0;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  void *local_38;
  
  pMVar1 = (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86[-3]);
  iVar15 = (int)pMVar1[-2].elemsize;
  _w = pMVar1[-2].elempack * *(int *)((long)&pMVar1[-2].elemsize + 4);
  uVar10 = (long)(int)pMVar1[-2].cstep / (long)(_w * iVar15);
  _h = (int)uVar10;
  Mat::reshape(&local_98,pMVar1,_w,_h,iVar15,(Allocator *)0x0);
  pMVar1 = &this->weight_data_t;
  p_Var14 = this->_vptr_DeformableConv2D_x86[-3];
  Mat::create(pMVar1,_h,
              *(int *)(&this->field_0xd8 + (long)p_Var14) *
              *(int *)(&this->field_0xd4 + (long)p_Var14),
              *(int *)(&this->field_0xd0 + (long)p_Var14),4,(Allocator *)0x0);
  local_38 = pMVar1->data;
  iVar15 = -100;
  if ((local_38 != (void *)0x0) &&
     (sVar2 = (this->weight_data_t).cstep, (long)(this->weight_data_t).c * sVar2 != 0)) {
    pp_Var3 = this->_vptr_DeformableConv2D_x86;
    sVar4 = (this->weight_data_t).elemsize;
    uVar11 = 0;
    uVar10 = uVar10 & 0xffffffff;
    if (_h < 1) {
      uVar10 = uVar11;
    }
    p_Var14 = pp_Var3[-3];
    puVar18 = (undefined4 *)local_98.data;
    for (; (long)uVar11 < (long)*(int *)(&this->field_0xd0 + (long)p_Var14); uVar11 = uVar11 + 1) {
      puVar16 = (undefined4 *)(sVar2 * sVar4 * uVar11 + (long)local_38);
      puVar13 = puVar18;
      for (lVar9 = 0; uVar12 = uVar10, puVar17 = puVar13,
          lVar9 < (long)*(int *)(&this->field_0xd8 + (long)p_Var14) *
                  (long)*(int *)(&this->field_0xd4 + (long)p_Var14); lVar9 = lVar9 + 1) {
        while (bVar19 = uVar12 != 0, uVar12 = uVar12 - 1, bVar19) {
          *puVar16 = *puVar17;
          puVar16 = puVar16 + 1;
          puVar17 = (undefined4 *)
                    ((long)puVar17 +
                    (long)local_98.w *
                    CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
        }
        p_Var14 = pp_Var3[-3];
        puVar13 = puVar13 + 1;
      }
      puVar18 = (undefined4 *)
                ((long)puVar18 +
                CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * local_98.cstep);
    }
    piVar7 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    local_48 = pMVar1;
    local_40 = opt;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          free(local_98.data);
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.c = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    p_Var14 = this->_vptr_DeformableConv2D_x86[-3];
    Mat::reshape(&local_128,pMVar1,
                 *(int *)(&this->field_0xd4 + (long)p_Var14) * _h *
                 *(int *)(&this->field_0xd8 + (long)p_Var14),
                 *(int *)(&this->field_0xd0 + (long)p_Var14),(Allocator *)0x0);
    piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (pMVar1 != &local_128) {
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      piVar7 = (this->weight_data_t).refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pAVar5 = (this->weight_data_t).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            free((this->weight_data_t).data);
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_t).data = local_128.data;
      piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).refcount = piVar7;
      (this->weight_data_t).elemsize =
           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      (this->weight_data_t).elempack = local_128.elempack;
      (this->weight_data_t).allocator = local_128.allocator;
      (this->weight_data_t).dims = local_128.dims;
      (this->weight_data_t).w = local_128.w;
      (this->weight_data_t).h = local_128.h;
      (this->weight_data_t).d = local_128.d;
      (this->weight_data_t).c = local_128.c;
      (this->weight_data_t).cstep = local_128.cstep;
    }
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          free(local_128.data);
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pLVar8 = create_layer(0xf);
    this->inner_product = pLVar8;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&pd,1,*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&pd,2,*(int *)(&this->field_0x100 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&pd,9,*(int *)(&this->field_0x104 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&pd,10,(Mat *)(&this->field_0x108 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    (*this->inner_product->_vptr_Layer[2])(this->inner_product,&pd);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    if (&local_128 != pMVar1) {
      piVar7 = (this->weight_data_t).refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      local_128.data = (this->weight_data_t).data;
      piVar7 = (this->weight_data_t).refcount;
      local_128.refcount._0_4_ = SUB84(piVar7,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
      sVar2 = (this->weight_data_t).elemsize;
      local_128.elemsize._0_4_ = (undefined4)sVar2;
      local_128.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      local_128.elempack = (this->weight_data_t).elempack;
      local_128.allocator = (this->weight_data_t).allocator;
      local_128.dims = (this->weight_data_t).dims;
      local_128.w = (this->weight_data_t).w;
      local_128.h = (this->weight_data_t).h;
      local_128.d = (this->weight_data_t).d;
      local_128.c = (this->weight_data_t).c;
      local_128.cstep = (this->weight_data_t).cstep;
    }
    local_a0 = 0;
    local_a8 = 0;
    uStack_ac = 0;
    uStack_b0 = 0;
    uStack_b4 = 0;
    uStack_b8 = 0;
    local_c0 = 0;
    local_c8 = 0;
    uStack_cc = 0;
    local_d0 = 0;
    uStack_d4 = 0;
    uStack_d8 = 0;
    local_e0 = 0;
    p_Var14 = this->_vptr_DeformableConv2D_x86[-3];
    if ((*(int *)(&this->field_0xfc + (long)p_Var14) != 0) &&
       (&local_e0 != (undefined8 *)(&this->field_0x198 + (long)p_Var14))) {
      piVar7 = *(int **)(&this->field_0x1a0 + (long)p_Var14);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      local_e0 = *(undefined8 *)(&this->field_0x198 + (long)p_Var14);
      uStack_d8 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var14);
      uStack_d4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var14) >> 0x20);
      local_d0 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var14);
      uStack_cc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var14) >> 0x20);
      local_c8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var14);
      local_c0 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var14);
      uStack_b8 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var14);
      uStack_b4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var14) >> 0x20);
      uStack_b0 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var14);
      uStack_ac = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var14) >> 0x20);
      local_a8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var14);
      local_a0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var14);
    }
    pLVar8 = this->inner_product;
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&permute_pd,&local_128);
    (*pLVar8->_vptr_Layer[3])(pLVar8,&permute_pd);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&permute_pd);
    (*this->inner_product->_vptr_Layer[4])();
    pLVar8 = create_layer(0x2f);
    this->permute = pLVar8;
    ParamDict::ParamDict(&permute_pd);
    ParamDict::set(&permute_pd,0,1);
    (*this->permute->_vptr_Layer[2])(this->permute,&permute_pd);
    (*this->permute->_vptr_Layer[4])(this->permute,opt);
    ParamDict::~ParamDict(&permute_pd);
    lVar9 = 0x48;
    do {
      piVar7 = *(int **)((long)&local_128.refcount + lVar9);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          plVar6 = *(long **)((long)&local_128.allocator + lVar9);
          if (plVar6 == (long *)0x0) {
            free(*(void **)((long)&local_128.data + lVar9));
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_128.cstep + lVar9) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar9 + 4) = 0;
      *(undefined8 *)((long)&local_128.elemsize + lVar9 + 4) = 0;
      *(undefined8 *)((long)&local_128.data + lVar9) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar9) = 0;
      *(undefined4 *)((long)&local_128.c + lVar9) = 0;
      *(undefined8 *)((long)&local_128.dims + lVar9) = 0;
      *(undefined8 *)((long)&local_128.h + lVar9) = 0;
      lVar9 = lVar9 + -0x48;
    } while (lVar9 != -0x48);
    ParamDict::~ParamDict(&pd);
    iVar15 = 0;
  }
  piVar7 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}